

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool google::ParseTemplateArg(State *state)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  undefined4 uVar7;
  undefined2 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  bool bVar11;
  State copy;
  
  pcVar2 = state->mangled_cur;
  pcVar3 = state->out_cur;
  pcVar4 = state->out_begin;
  pcVar5 = state->out_end;
  pcVar6 = state->prev_name;
  uVar7 = state->prev_name_length;
  uVar8 = state->nest_level;
  uVar9 = state->append;
  uVar10 = state->overflowed;
  if ((byte)(*state->mangled_cur + 0xb7U) < 2) {
    state->mangled_cur = state->mangled_cur + 1;
    do {
      bVar11 = ParseTemplateArg(state);
    } while (bVar11);
    pcVar1 = state->mangled_cur;
    if (*pcVar1 != 'E') goto LAB_0011fee5;
LAB_0011fedd:
    bVar11 = true;
    state->mangled_cur = pcVar1 + 1;
  }
  else {
LAB_0011fee5:
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->prev_name = pcVar6;
    state->prev_name_length = uVar7;
    state->nest_level = uVar8;
    state->append = (bool)uVar9;
    state->overflowed = (bool)uVar10;
    state->mangled_cur = pcVar2;
    state->out_cur = pcVar3;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    bVar11 = ParseType(state);
    if (bVar11) {
      return true;
    }
    bVar11 = ParseExprPrimary(state);
    if (bVar11) {
      return true;
    }
    state->mangled_cur = pcVar2;
    state->out_cur = pcVar3;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->prev_name = pcVar6;
    state->prev_name_length = uVar7;
    state->nest_level = uVar8;
    state->append = (bool)uVar9;
    state->overflowed = (bool)uVar10;
    if (*state->mangled_cur == 'X') {
      state->mangled_cur = state->mangled_cur + 1;
      bVar11 = ParseExpression(state);
      if ((bVar11) && (pcVar1 = state->mangled_cur, *pcVar1 == 'E')) goto LAB_0011fedd;
    }
    bVar11 = false;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->prev_name = pcVar6;
    state->prev_name_length = uVar7;
    state->nest_level = uVar8;
    state->append = (bool)uVar9;
    state->overflowed = (bool)uVar10;
    state->mangled_cur = pcVar2;
    state->out_cur = pcVar3;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
  }
  return bVar11;
}

Assistant:

static bool ParseTemplateArg(State *state) {
  State copy = *state;
  if ((ParseOneCharToken(state, 'I') || ParseOneCharToken(state, 'J')) &&
      ZeroOrMore(ParseTemplateArg, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  *state = copy;

  if (ParseType(state) ||
      ParseExprPrimary(state)) {
    return true;
  }
  *state = copy;

  if (ParseOneCharToken(state, 'X') && ParseExpression(state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  *state = copy;
  return false;
}